

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_SepInt_Test::TestBody(TApp_SepInt_Test *this)

{
  App *this_00;
  long lVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  allocator local_f1;
  AssertHelper local_f0;
  int i;
  AssertionResult gtest_ar;
  string local_c0 [32];
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"-i,--int",(allocator *)&gtest_ar);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_100);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_40,&i,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&gtest_ar,"-i",(allocator *)&local_100);
  std::__cxx11::string::string(local_c0,"4",(allocator *)&local_f0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&gtest_ar,&local_a0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  local_100.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_80,"--int",&local_f1);
  local_f0.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_80);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"--int\")",(unsigned_long *)&local_100,
             (unsigned_long *)&local_f0);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_100.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_a0,"-i",&local_f1);
  local_f0.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_a0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"-i\")",(unsigned_long *)&local_100,
             (unsigned_long *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_100.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"i","4",&i,(int *)&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TApp, SepInt) {
    int i;
    app.add_option("-i,--int", i);
    args = {"-i", "4"};
    run();
    EXPECT_EQ((size_t)1, app.count("--int"));
    EXPECT_EQ((size_t)1, app.count("-i"));
    EXPECT_EQ(i, 4);
}